

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_STDDEV.c
# Opt level: O0

void TA_INT_stddev_using_precalc_ma
               (double *inReal,double *inMovAvg,int inMovAvgBegIdx,int inMovAvgNbElement,
               int timePeriod,double *output)

{
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  long in_R9;
  double dVar1;
  double dVar2;
  int endSum;
  int startSum;
  int outIdx;
  double meanValue2;
  double periodTotal2;
  double tempReal;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined8 local_38;
  
  local_38 = 0.0;
  local_48 = (in_EDX + 1) - in_R8D;
  for (local_44 = local_48; local_44 < in_EDX; local_44 = local_44 + 1) {
    dVar2 = *(double *)(in_RDI + (long)local_44 * 8);
    local_38 = dVar2 * dVar2 + local_38;
  }
  local_4c = in_EDX;
  for (local_44 = 0; local_44 < in_ECX; local_44 = local_44 + 1) {
    dVar2 = *(double *)(in_RDI + (long)local_4c * 8);
    dVar1 = dVar2 * dVar2 + local_38;
    dVar2 = *(double *)(in_RDI + (long)local_48 * 8);
    local_38 = dVar1 - dVar2 * dVar2;
    dVar2 = *(double *)(in_RSI + (long)local_44 * 8);
    dVar2 = dVar1 / (double)in_R8D - dVar2 * dVar2;
    if (dVar2 < 1e-14) {
      *(undefined8 *)(in_R9 + (long)local_44 * 8) = 0;
    }
    else {
      dVar2 = sqrt(dVar2);
      *(double *)(in_R9 + (long)local_44 * 8) = dVar2;
    }
    local_48 = local_48 + 1;
    local_4c = local_4c + 1;
  }
  return;
}

Assistant:

void TA_PREFIX(INT_stddev_using_precalc_ma)( const INPUT_TYPE *inReal,
                                             const double *inMovAvg,
                                             int inMovAvgBegIdx,
                                             int inMovAvgNbElement,
                                             int timePeriod,
                                             double *output )
#endif
{
   double tempReal, periodTotal2, meanValue2;
   int outIdx;

   /* Start/end index for sumation. */
   int startSum, endSum;

   startSum = 1+inMovAvgBegIdx-timePeriod;
   endSum = inMovAvgBegIdx;

   periodTotal2 = 0;

   for( outIdx = startSum; outIdx < endSum; outIdx++)
   {
      tempReal = inReal[outIdx];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
   }

   for( outIdx=0; outIdx < inMovAvgNbElement; outIdx++, startSum++, endSum++ )
   {
      tempReal = inReal[endSum];
      tempReal *= tempReal;
      periodTotal2 += tempReal;
      meanValue2 = periodTotal2/timePeriod;

      tempReal = inReal[startSum];
      tempReal *= tempReal;
      periodTotal2 -= tempReal;

      tempReal = inMovAvg[outIdx];
      tempReal *= tempReal;
      meanValue2 -= tempReal;

      if( !TA_IS_ZERO_OR_NEG(meanValue2) )
         output[outIdx] = std_sqrt(meanValue2);
      else
         output[outIdx] = (double)0.0;
   }
}